

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_16.c
# Opt level: O1

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ushort *puVar1;
  short *psVar2;
  uint uVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  int *piVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  parasail_result_t *ppVar19;
  __m128i *ptr;
  __m128i *palVar20;
  __m128i *ptr_00;
  int16_t *ptr_01;
  ulong uVar21;
  ulong uVar22;
  int16_t iVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  long lVar29;
  __m128i *ptr_02;
  undefined2 uVar30;
  int iVar31;
  ulong uVar32;
  long lVar33;
  long lVar34;
  int iVar35;
  bool bVar36;
  undefined4 uVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  short sVar47;
  short sVar48;
  ulong uVar49;
  undefined1 auVar50 [16];
  ushort uVar51;
  ushort uVar56;
  ushort uVar58;
  ushort uVar60;
  ushort uVar62;
  ushort uVar64;
  ushort uVar66;
  ushort uVar68;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  __m128i_16_t e;
  __m128i_16_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  short sVar37;
  short sVar42;
  short sVar52;
  short sVar57;
  short sVar59;
  short sVar61;
  short sVar63;
  short sVar65;
  short sVar67;
  short sVar69;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_nw_table_striped_profile_sse41_128_16_cold_8();
  }
  else {
    pvVar4 = (profile->profile16).score;
    if (pvVar4 == (void *)0x0) {
      parasail_nw_table_striped_profile_sse41_128_16_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_nw_table_striped_profile_sse41_128_16_cold_6();
      }
      else {
        uVar3 = profile->s1Len;
        if ((int)uVar3 < 1) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_nw_table_striped_profile_sse41_128_16_cold_4();
        }
        else {
          uVar27 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_nw_table_striped_profile_sse41_128_16_cold_3();
          }
          else if (open < 0) {
            parasail_nw_table_striped_profile_sse41_128_16_cold_2();
          }
          else if (gap < 0) {
            parasail_nw_table_striped_profile_sse41_128_16_cold_1();
          }
          else {
            iVar26 = uVar3 - 1;
            uVar32 = (ulong)uVar3 + 7 >> 3;
            iVar31 = (int)uVar32;
            iVar35 = -open;
            iVar18 = ppVar5->min;
            iVar14 = -iVar18;
            if (iVar18 != iVar35 && SBORROW4(iVar18,iVar35) == iVar18 + open < 0) {
              iVar14 = open;
            }
            iVar15 = ppVar5->max;
            ppVar19 = parasail_result_new_table1((uint)((ulong)uVar3 + 7) & 0x7ffffff8,s2Len);
            if (ppVar19 != (parasail_result_t *)0x0) {
              ppVar19->flag = ppVar19->flag | 0x8220801;
              ptr = parasail_memalign___m128i(0x10,uVar32);
              palVar20 = parasail_memalign___m128i(0x10,uVar32);
              ptr_00 = parasail_memalign___m128i(0x10,uVar32);
              ptr_01 = parasail_memalign_int16_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_01 != (int16_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                  (palVar20 != (__m128i *)0x0 && ptr != (__m128i *)0x0)) {
                iVar16 = s2Len + -1;
                iVar17 = 7 - iVar26 / iVar31;
                auVar39 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
                uVar38 = auVar39._0_4_;
                auVar45._4_4_ = uVar38;
                auVar45._0_4_ = uVar38;
                auVar45._8_4_ = uVar38;
                auVar45._12_4_ = uVar38;
                auVar39 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
                uVar38 = auVar39._0_4_;
                auVar39 = pshuflw(ZEXT416(iVar14 - 0x7fff),ZEXT416(iVar14 - 0x7fff),0);
                auVar40._0_4_ = auVar39._0_4_;
                auVar40._4_4_ = auVar40._0_4_;
                auVar40._8_4_ = auVar40._0_4_;
                auVar40._12_4_ = auVar40._0_4_;
                auVar43 = ZEXT416(CONCAT22((short)((uint)iVar18 >> 0x10),0x7ffe - (short)iVar15));
                auVar43 = pshuflw(auVar43,auVar43,0);
                auVar44._0_4_ = auVar43._0_4_;
                auVar44._4_4_ = auVar44._0_4_;
                auVar44._8_4_ = auVar44._0_4_;
                auVar44._12_4_ = auVar44._0_4_;
                lVar24 = (long)iVar35;
                uVar28 = 0;
                do {
                  lVar25 = 0;
                  lVar29 = lVar24;
                  do {
                    uVar30 = 0x8000;
                    if (-0x8000 < lVar29) {
                      uVar30 = (undefined2)lVar29;
                    }
                    *(undefined2 *)((long)&local_48 + lVar25 * 2) = uVar30;
                    lVar33 = lVar29 - (ulong)(uint)open;
                    if (lVar33 < -0x7fff) {
                      lVar33 = -0x8000;
                    }
                    *(short *)((long)&local_58 + lVar25 * 2) = (short)lVar33;
                    lVar25 = lVar25 + 1;
                    lVar29 = lVar29 - uVar32 * (uint)gap;
                  } while (lVar25 != 8);
                  ptr[uVar28][0] = local_48;
                  ptr[uVar28][1] = lStack_40;
                  ptr_00[uVar28][0] = local_58;
                  ptr_00[uVar28][1] = lStack_50;
                  uVar28 = uVar28 + 1;
                  lVar24 = lVar24 - (ulong)(uint)gap;
                } while (uVar28 != uVar32);
                *ptr_01 = 0;
                uVar28 = 1;
                if (1 < s2Len) {
                  uVar28 = uVar27;
                }
                uVar22 = 0;
                do {
                  iVar23 = -0x8000;
                  if (-0x8000 < iVar35) {
                    iVar23 = (int16_t)iVar35;
                  }
                  ptr_01[uVar22 + 1] = iVar23;
                  iVar35 = iVar35 - gap;
                  uVar22 = uVar22 + 1;
                } while (uVar28 != uVar22);
                uVar28 = 1;
                if (1 < s2Len) {
                  uVar28 = uVar27;
                }
                lVar24 = uVar32 * uVar27;
                lVar29 = (ulong)(iVar31 + (uint)(iVar31 == 0)) << 4;
                lVar25 = 0;
                uVar22 = 0;
                auVar72 = auVar40;
                do {
                  ptr_02 = ptr;
                  ptr = palVar20;
                  iVar18 = ppVar5->mapper[(byte)s2[uVar22]];
                  uVar21 = ptr_02[iVar31 - 1][0];
                  auVar70._8_8_ = ptr_02[iVar31 - 1][1] << 0x10 | uVar21 >> 0x30;
                  auVar70._0_8_ = uVar21 << 0x10 | (ulong)(ushort)ptr_01[uVar22];
                  lVar34 = 0;
                  lVar33 = lVar25;
                  auVar46 = auVar72;
                  auVar50 = auVar40;
                  do {
                    auVar72 = paddsw(auVar70,*(undefined1 (*) [16])
                                              ((long)pvVar4 + lVar34 + uVar32 * (long)iVar18 * 0x10)
                                    );
                    auVar70 = *(undefined1 (*) [16])((long)*ptr_00 + lVar34);
                    sVar37 = auVar50._0_2_;
                    sVar52 = auVar70._0_2_;
                    uVar51 = (ushort)(sVar52 < sVar37) * sVar37 |
                             (ushort)(sVar52 >= sVar37) * sVar52;
                    sVar7 = auVar50._2_2_;
                    sVar57 = auVar70._2_2_;
                    uVar56 = (ushort)(sVar57 < sVar7) * sVar7 | (ushort)(sVar57 >= sVar7) * sVar57;
                    sVar8 = auVar50._4_2_;
                    sVar59 = auVar70._4_2_;
                    uVar58 = (ushort)(sVar59 < sVar8) * sVar8 | (ushort)(sVar59 >= sVar8) * sVar59;
                    sVar9 = auVar50._6_2_;
                    sVar61 = auVar70._6_2_;
                    uVar60 = (ushort)(sVar61 < sVar9) * sVar9 | (ushort)(sVar61 >= sVar9) * sVar61;
                    sVar10 = auVar50._8_2_;
                    sVar63 = auVar70._8_2_;
                    uVar62 = (ushort)(sVar63 < sVar10) * sVar10 |
                             (ushort)(sVar63 >= sVar10) * sVar63;
                    sVar11 = auVar50._10_2_;
                    sVar65 = auVar70._10_2_;
                    uVar64 = (ushort)(sVar65 < sVar11) * sVar11 |
                             (ushort)(sVar65 >= sVar11) * sVar65;
                    sVar12 = auVar50._12_2_;
                    sVar67 = auVar70._12_2_;
                    sVar69 = auVar70._14_2_;
                    uVar66 = (ushort)(sVar67 < sVar12) * sVar12 |
                             (ushort)(sVar67 >= sVar12) * sVar67;
                    sVar48 = auVar50._14_2_;
                    uVar68 = (ushort)(sVar69 < sVar48) * sVar48 |
                             (ushort)(sVar69 >= sVar48) * sVar69;
                    sVar42 = auVar72._0_2_;
                    auVar53._0_2_ =
                         (ushort)((short)uVar51 < sVar42) * sVar42 |
                         ((short)uVar51 >= sVar42) * uVar51;
                    sVar42 = auVar72._2_2_;
                    auVar53._2_2_ =
                         (ushort)((short)uVar56 < sVar42) * sVar42 |
                         ((short)uVar56 >= sVar42) * uVar56;
                    sVar42 = auVar72._4_2_;
                    auVar53._4_2_ =
                         (ushort)((short)uVar58 < sVar42) * sVar42 |
                         ((short)uVar58 >= sVar42) * uVar58;
                    sVar42 = auVar72._6_2_;
                    auVar53._6_2_ =
                         (ushort)((short)uVar60 < sVar42) * sVar42 |
                         ((short)uVar60 >= sVar42) * uVar60;
                    sVar42 = auVar72._8_2_;
                    auVar53._8_2_ =
                         (ushort)((short)uVar62 < sVar42) * sVar42 |
                         ((short)uVar62 >= sVar42) * uVar62;
                    sVar42 = auVar72._10_2_;
                    auVar53._10_2_ =
                         (ushort)((short)uVar64 < sVar42) * sVar42 |
                         ((short)uVar64 >= sVar42) * uVar64;
                    sVar42 = auVar72._12_2_;
                    auVar53._12_2_ =
                         (ushort)((short)uVar66 < sVar42) * sVar42 |
                         ((short)uVar66 >= sVar42) * uVar66;
                    sVar42 = auVar72._14_2_;
                    auVar53._14_2_ =
                         (ushort)((short)uVar68 < sVar42) * sVar42 |
                         ((short)uVar68 >= sVar42) * uVar68;
                    *(undefined1 (*) [16])((long)*ptr + lVar34) = auVar53;
                    piVar6 = ((ppVar19->field_4).rowcols)->score_row;
                    *(int *)((long)piVar6 + lVar33) = (int)(short)auVar53._0_2_;
                    *(int *)((long)piVar6 + lVar24 * 4 + lVar33) = (int)(short)auVar53._2_2_;
                    *(int *)((long)piVar6 + lVar24 * 8 + lVar33) = (int)(short)auVar53._4_2_;
                    *(int *)((long)piVar6 + lVar24 * 0xc + lVar33) = (int)(short)auVar53._6_2_;
                    *(int *)((long)piVar6 + lVar24 * 0x10 + lVar33) = (int)(short)auVar53._8_2_;
                    *(int *)((long)piVar6 + lVar24 * 0x14 + lVar33) = (int)(short)auVar53._10_2_;
                    *(int *)((long)piVar6 + lVar24 * 0x18 + lVar33) = (int)(short)auVar53._12_2_;
                    *(int *)((long)piVar6 + lVar24 * 0x1c + lVar33) = (int)(short)auVar53._14_2_;
                    sVar42 = auVar46._0_2_;
                    auVar72._0_2_ =
                         (sVar42 < (short)auVar53._0_2_) * auVar53._0_2_ |
                         (ushort)(sVar42 >= (short)auVar53._0_2_) * sVar42;
                    sVar42 = auVar46._2_2_;
                    auVar72._2_2_ =
                         (sVar42 < (short)auVar53._2_2_) * auVar53._2_2_ |
                         (ushort)(sVar42 >= (short)auVar53._2_2_) * sVar42;
                    sVar42 = auVar46._4_2_;
                    auVar72._4_2_ =
                         (sVar42 < (short)auVar53._4_2_) * auVar53._4_2_ |
                         (ushort)(sVar42 >= (short)auVar53._4_2_) * sVar42;
                    sVar42 = auVar46._6_2_;
                    auVar72._6_2_ =
                         (sVar42 < (short)auVar53._6_2_) * auVar53._6_2_ |
                         (ushort)(sVar42 >= (short)auVar53._6_2_) * sVar42;
                    sVar42 = auVar46._8_2_;
                    auVar72._8_2_ =
                         (sVar42 < (short)auVar53._8_2_) * auVar53._8_2_ |
                         (ushort)(sVar42 >= (short)auVar53._8_2_) * sVar42;
                    sVar42 = auVar46._10_2_;
                    auVar72._10_2_ =
                         (sVar42 < (short)auVar53._10_2_) * auVar53._10_2_ |
                         (ushort)(sVar42 >= (short)auVar53._10_2_) * sVar42;
                    sVar42 = auVar46._12_2_;
                    sVar47 = auVar46._14_2_;
                    auVar72._12_2_ =
                         (sVar42 < (short)auVar53._12_2_) * auVar53._12_2_ |
                         (ushort)(sVar42 >= (short)auVar53._12_2_) * sVar42;
                    auVar72._14_2_ =
                         (sVar47 < (short)auVar53._14_2_) * auVar53._14_2_ |
                         (ushort)(sVar47 >= (short)auVar53._14_2_) * sVar47;
                    sVar42 = auVar44._0_2_;
                    uVar51 = (ushort)(sVar52 < sVar42) * sVar52 |
                             (ushort)(sVar52 >= sVar42) * sVar42;
                    sVar42 = auVar44._2_2_;
                    uVar56 = (ushort)(sVar57 < sVar42) * sVar57 |
                             (ushort)(sVar57 >= sVar42) * sVar42;
                    sVar42 = auVar44._4_2_;
                    uVar58 = (ushort)(sVar59 < sVar42) * sVar59 |
                             (ushort)(sVar59 >= sVar42) * sVar42;
                    sVar42 = auVar44._6_2_;
                    uVar60 = (ushort)(sVar61 < sVar42) * sVar61 |
                             (ushort)(sVar61 >= sVar42) * sVar42;
                    sVar42 = auVar44._8_2_;
                    uVar62 = (ushort)(sVar63 < sVar42) * sVar63 |
                             (ushort)(sVar63 >= sVar42) * sVar42;
                    sVar42 = auVar44._10_2_;
                    uVar64 = (ushort)(sVar65 < sVar42) * sVar65 |
                             (ushort)(sVar65 >= sVar42) * sVar42;
                    sVar42 = auVar44._12_2_;
                    sVar47 = auVar44._14_2_;
                    uVar66 = (ushort)(sVar67 < sVar42) * sVar67 |
                             (ushort)(sVar67 >= sVar42) * sVar42;
                    uVar68 = (ushort)(sVar69 < sVar47) * sVar69 |
                             (ushort)(sVar69 >= sVar47) * sVar47;
                    uVar51 = (ushort)(sVar37 < (short)uVar51) * sVar37 |
                             (sVar37 >= (short)uVar51) * uVar51;
                    uVar56 = (ushort)(sVar7 < (short)uVar56) * sVar7 |
                             (sVar7 >= (short)uVar56) * uVar56;
                    uVar58 = (ushort)(sVar8 < (short)uVar58) * sVar8 |
                             (sVar8 >= (short)uVar58) * uVar58;
                    uVar60 = (ushort)(sVar9 < (short)uVar60) * sVar9 |
                             (sVar9 >= (short)uVar60) * uVar60;
                    uVar62 = (ushort)(sVar10 < (short)uVar62) * sVar10 |
                             (sVar10 >= (short)uVar62) * uVar62;
                    uVar64 = (ushort)(sVar11 < (short)uVar64) * sVar11 |
                             (sVar11 >= (short)uVar64) * uVar64;
                    uVar66 = (ushort)(sVar12 < (short)uVar66) * sVar12 |
                             (sVar12 >= (short)uVar66) * uVar66;
                    uVar68 = (ushort)(sVar48 < (short)uVar68) * sVar48 |
                             (sVar48 >= (short)uVar68) * uVar68;
                    auVar44._0_2_ =
                         ((short)auVar53._0_2_ < (short)uVar51) * auVar53._0_2_ |
                         ((short)auVar53._0_2_ >= (short)uVar51) * uVar51;
                    auVar44._2_2_ =
                         ((short)auVar53._2_2_ < (short)uVar56) * auVar53._2_2_ |
                         ((short)auVar53._2_2_ >= (short)uVar56) * uVar56;
                    auVar44._4_2_ =
                         ((short)auVar53._4_2_ < (short)uVar58) * auVar53._4_2_ |
                         ((short)auVar53._4_2_ >= (short)uVar58) * uVar58;
                    auVar44._6_2_ =
                         ((short)auVar53._6_2_ < (short)uVar60) * auVar53._6_2_ |
                         ((short)auVar53._6_2_ >= (short)uVar60) * uVar60;
                    auVar44._8_2_ =
                         ((short)auVar53._8_2_ < (short)uVar62) * auVar53._8_2_ |
                         ((short)auVar53._8_2_ >= (short)uVar62) * uVar62;
                    auVar44._10_2_ =
                         ((short)auVar53._10_2_ < (short)uVar64) * auVar53._10_2_ |
                         ((short)auVar53._10_2_ >= (short)uVar64) * uVar64;
                    auVar44._12_2_ =
                         ((short)auVar53._12_2_ < (short)uVar66) * auVar53._12_2_ |
                         ((short)auVar53._12_2_ >= (short)uVar66) * uVar66;
                    auVar44._14_2_ =
                         ((short)auVar53._14_2_ < (short)uVar68) * auVar53._14_2_ |
                         ((short)auVar53._14_2_ >= (short)uVar68) * uVar68;
                    auVar54 = psubsw(auVar53,auVar45);
                    auVar46._4_4_ = uVar38;
                    auVar46._0_4_ = uVar38;
                    auVar46._8_4_ = uVar38;
                    auVar46._12_4_ = uVar38;
                    auVar70 = psubsw(auVar70,auVar46);
                    sVar37 = auVar54._0_2_;
                    sVar48 = auVar70._0_2_;
                    sVar42 = auVar54._2_2_;
                    sVar47 = auVar70._2_2_;
                    sVar7 = auVar54._4_2_;
                    sVar52 = auVar70._4_2_;
                    sVar8 = auVar54._6_2_;
                    sVar57 = auVar70._6_2_;
                    sVar9 = auVar54._8_2_;
                    sVar59 = auVar70._8_2_;
                    sVar10 = auVar54._10_2_;
                    sVar61 = auVar70._10_2_;
                    sVar11 = auVar54._12_2_;
                    sVar63 = auVar70._12_2_;
                    sVar65 = auVar70._14_2_;
                    sVar12 = auVar54._14_2_;
                    puVar1 = (ushort *)((long)*ptr_00 + lVar34);
                    *puVar1 = (ushort)(sVar48 < sVar37) * sVar37 |
                              (ushort)(sVar48 >= sVar37) * sVar48;
                    puVar1[1] = (ushort)(sVar47 < sVar42) * sVar42 |
                                (ushort)(sVar47 >= sVar42) * sVar47;
                    puVar1[2] = (ushort)(sVar52 < sVar7) * sVar7 |
                                (ushort)(sVar52 >= sVar7) * sVar52;
                    puVar1[3] = (ushort)(sVar57 < sVar8) * sVar8 |
                                (ushort)(sVar57 >= sVar8) * sVar57;
                    puVar1[4] = (ushort)(sVar59 < sVar9) * sVar9 |
                                (ushort)(sVar59 >= sVar9) * sVar59;
                    puVar1[5] = (ushort)(sVar61 < sVar10) * sVar10 |
                                (ushort)(sVar61 >= sVar10) * sVar61;
                    puVar1[6] = (ushort)(sVar63 < sVar11) * sVar11 |
                                (ushort)(sVar63 >= sVar11) * sVar63;
                    puVar1[7] = (ushort)(sVar65 < sVar12) * sVar12 |
                                (ushort)(sVar65 >= sVar12) * sVar65;
                    auVar54._4_4_ = uVar38;
                    auVar54._0_4_ = uVar38;
                    auVar54._8_4_ = uVar38;
                    auVar54._12_4_ = uVar38;
                    auVar70 = psubsw(auVar50,auVar54);
                    sVar48 = auVar70._0_2_;
                    auVar50._0_2_ =
                         (ushort)(sVar48 < sVar37) * sVar37 | (ushort)(sVar48 >= sVar37) * sVar48;
                    sVar37 = auVar70._2_2_;
                    auVar50._2_2_ =
                         (ushort)(sVar37 < sVar42) * sVar42 | (ushort)(sVar37 >= sVar42) * sVar37;
                    sVar37 = auVar70._4_2_;
                    auVar50._4_2_ =
                         (ushort)(sVar37 < sVar7) * sVar7 | (ushort)(sVar37 >= sVar7) * sVar37;
                    sVar37 = auVar70._6_2_;
                    auVar50._6_2_ =
                         (ushort)(sVar37 < sVar8) * sVar8 | (ushort)(sVar37 >= sVar8) * sVar37;
                    sVar37 = auVar70._8_2_;
                    auVar50._8_2_ =
                         (ushort)(sVar37 < sVar9) * sVar9 | (ushort)(sVar37 >= sVar9) * sVar37;
                    sVar37 = auVar70._10_2_;
                    auVar50._10_2_ =
                         (ushort)(sVar37 < sVar10) * sVar10 | (ushort)(sVar37 >= sVar10) * sVar37;
                    sVar37 = auVar70._12_2_;
                    sVar42 = auVar70._14_2_;
                    auVar50._12_2_ =
                         (ushort)(sVar37 < sVar11) * sVar11 | (ushort)(sVar37 >= sVar11) * sVar37;
                    auVar50._14_2_ =
                         (ushort)(sVar42 < sVar12) * sVar12 | (ushort)(sVar42 >= sVar12) * sVar42;
                    auVar70 = *(undefined1 (*) [16])((long)*ptr_02 + lVar34);
                    lVar34 = lVar34 + 0x10;
                    lVar33 = lVar33 + uVar27 * 4;
                    auVar46 = auVar72;
                  } while (lVar29 != lVar34);
                  uVar3 = 0;
                  do {
                    uVar49 = auVar50._0_8_;
                    auVar50._8_8_ = auVar50._8_8_ << 0x10 | uVar49 >> 0x30;
                    uVar21 = (ulong)(uint)(ptr_01[uVar22 + 1] - open);
                    if (ptr_01[uVar22 + 1] - open < -0x7fff) {
                      uVar21 = 0xffff8000;
                    }
                    auVar50._0_8_ = uVar49 << 0x10 | uVar21 & 0xffff;
                    bVar36 = true;
                    uVar21 = 1;
                    lVar34 = 0;
                    lVar33 = lVar25;
                    auVar70 = auVar72;
                    auVar46 = auVar44;
                    do {
                      psVar2 = (short *)((long)*ptr + lVar34);
                      sVar42 = *psVar2;
                      sVar7 = psVar2[1];
                      sVar8 = psVar2[2];
                      sVar9 = psVar2[3];
                      sVar10 = psVar2[4];
                      sVar11 = psVar2[5];
                      sVar12 = psVar2[6];
                      sVar48 = psVar2[7];
                      sVar37 = auVar50._0_2_;
                      auVar55._0_2_ =
                           (ushort)(sVar42 < sVar37) * sVar37 | (ushort)(sVar42 >= sVar37) * sVar42;
                      sVar37 = auVar50._2_2_;
                      auVar55._2_2_ =
                           (ushort)(sVar7 < sVar37) * sVar37 | (ushort)(sVar7 >= sVar37) * sVar7;
                      sVar37 = auVar50._4_2_;
                      auVar55._4_2_ =
                           (ushort)(sVar8 < sVar37) * sVar37 | (ushort)(sVar8 >= sVar37) * sVar8;
                      sVar37 = auVar50._6_2_;
                      auVar55._6_2_ =
                           (ushort)(sVar9 < sVar37) * sVar37 | (ushort)(sVar9 >= sVar37) * sVar9;
                      sVar37 = auVar50._8_2_;
                      auVar55._8_2_ =
                           (ushort)(sVar10 < sVar37) * sVar37 | (ushort)(sVar10 >= sVar37) * sVar10;
                      sVar37 = auVar50._10_2_;
                      auVar55._10_2_ =
                           (ushort)(sVar11 < sVar37) * sVar37 | (ushort)(sVar11 >= sVar37) * sVar11;
                      sVar37 = auVar50._12_2_;
                      auVar55._12_2_ =
                           (ushort)(sVar12 < sVar37) * sVar37 | (ushort)(sVar12 >= sVar37) * sVar12;
                      sVar37 = auVar50._14_2_;
                      auVar55._14_2_ =
                           (ushort)(sVar48 < sVar37) * sVar37 | (ushort)(sVar48 >= sVar37) * sVar48;
                      *(undefined1 (*) [16])((long)*ptr + lVar34) = auVar55;
                      sVar37 = auVar46._0_2_;
                      auVar44._0_2_ =
                           ((short)auVar55._0_2_ < sVar37) * auVar55._0_2_ |
                           (ushort)((short)auVar55._0_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._2_2_;
                      auVar44._2_2_ =
                           ((short)auVar55._2_2_ < sVar37) * auVar55._2_2_ |
                           (ushort)((short)auVar55._2_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._4_2_;
                      auVar44._4_2_ =
                           ((short)auVar55._4_2_ < sVar37) * auVar55._4_2_ |
                           (ushort)((short)auVar55._4_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._6_2_;
                      auVar44._6_2_ =
                           ((short)auVar55._6_2_ < sVar37) * auVar55._6_2_ |
                           (ushort)((short)auVar55._6_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._8_2_;
                      auVar44._8_2_ =
                           ((short)auVar55._8_2_ < sVar37) * auVar55._8_2_ |
                           (ushort)((short)auVar55._8_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._10_2_;
                      auVar44._10_2_ =
                           ((short)auVar55._10_2_ < sVar37) * auVar55._10_2_ |
                           (ushort)((short)auVar55._10_2_ >= sVar37) * sVar37;
                      sVar37 = auVar46._12_2_;
                      sVar42 = auVar46._14_2_;
                      auVar44._12_2_ =
                           ((short)auVar55._12_2_ < sVar37) * auVar55._12_2_ |
                           (ushort)((short)auVar55._12_2_ >= sVar37) * sVar37;
                      auVar44._14_2_ =
                           ((short)auVar55._14_2_ < sVar42) * auVar55._14_2_ |
                           (ushort)((short)auVar55._14_2_ >= sVar42) * sVar42;
                      sVar37 = auVar70._0_2_;
                      auVar72._0_2_ =
                           (sVar37 < (short)auVar55._0_2_) * auVar55._0_2_ |
                           (ushort)(sVar37 >= (short)auVar55._0_2_) * sVar37;
                      sVar37 = auVar70._2_2_;
                      auVar72._2_2_ =
                           (sVar37 < (short)auVar55._2_2_) * auVar55._2_2_ |
                           (ushort)(sVar37 >= (short)auVar55._2_2_) * sVar37;
                      sVar37 = auVar70._4_2_;
                      auVar72._4_2_ =
                           (sVar37 < (short)auVar55._4_2_) * auVar55._4_2_ |
                           (ushort)(sVar37 >= (short)auVar55._4_2_) * sVar37;
                      sVar37 = auVar70._6_2_;
                      auVar72._6_2_ =
                           (sVar37 < (short)auVar55._6_2_) * auVar55._6_2_ |
                           (ushort)(sVar37 >= (short)auVar55._6_2_) * sVar37;
                      sVar37 = auVar70._8_2_;
                      auVar72._8_2_ =
                           (sVar37 < (short)auVar55._8_2_) * auVar55._8_2_ |
                           (ushort)(sVar37 >= (short)auVar55._8_2_) * sVar37;
                      sVar37 = auVar70._10_2_;
                      auVar72._10_2_ =
                           (sVar37 < (short)auVar55._10_2_) * auVar55._10_2_ |
                           (ushort)(sVar37 >= (short)auVar55._10_2_) * sVar37;
                      sVar37 = auVar70._12_2_;
                      sVar42 = auVar70._14_2_;
                      auVar72._12_2_ =
                           (sVar37 < (short)auVar55._12_2_) * auVar55._12_2_ |
                           (ushort)(sVar37 >= (short)auVar55._12_2_) * sVar37;
                      auVar72._14_2_ =
                           (sVar42 < (short)auVar55._14_2_) * auVar55._14_2_ |
                           (ushort)(sVar42 >= (short)auVar55._14_2_) * sVar42;
                      piVar6 = ((ppVar19->field_4).rowcols)->score_row;
                      *(int *)((long)piVar6 + lVar33) = (int)(short)auVar55._0_2_;
                      *(int *)((long)piVar6 + lVar24 * 4 + lVar33) = (int)(short)auVar55._2_2_;
                      *(int *)((long)piVar6 + lVar24 * 8 + lVar33) = (int)(short)auVar55._4_2_;
                      *(int *)((long)piVar6 + lVar24 * 0xc + lVar33) = (int)(short)auVar55._6_2_;
                      *(int *)((long)piVar6 + lVar24 * 0x10 + lVar33) = (int)(short)auVar55._8_2_;
                      *(int *)((long)piVar6 + lVar24 * 0x14 + lVar33) = (int)(short)auVar55._10_2_;
                      *(int *)((long)piVar6 + lVar24 * 0x18 + lVar33) = (int)(short)auVar55._12_2_;
                      *(int *)((long)piVar6 + lVar24 * 0x1c + lVar33) = (int)(short)auVar55._14_2_;
                      auVar70 = psubsw(auVar55,auVar45);
                      auVar13._4_4_ = uVar38;
                      auVar13._0_4_ = uVar38;
                      auVar13._8_4_ = uVar38;
                      auVar13._12_4_ = uVar38;
                      auVar50 = psubsw(auVar50,auVar13);
                      auVar71._0_2_ = -(ushort)(auVar70._0_2_ < auVar50._0_2_);
                      auVar71._2_2_ = -(ushort)(auVar70._2_2_ < auVar50._2_2_);
                      auVar71._4_2_ = -(ushort)(auVar70._4_2_ < auVar50._4_2_);
                      auVar71._6_2_ = -(ushort)(auVar70._6_2_ < auVar50._6_2_);
                      auVar71._8_2_ = -(ushort)(auVar70._8_2_ < auVar50._8_2_);
                      auVar71._10_2_ = -(ushort)(auVar70._10_2_ < auVar50._10_2_);
                      auVar71._12_2_ = -(ushort)(auVar70._12_2_ < auVar50._12_2_);
                      auVar71._14_2_ = -(ushort)(auVar70._14_2_ < auVar50._14_2_);
                      if ((((((((((((((((auVar71 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar71 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar71 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar71 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar71 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar71 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar71 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar71 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar71 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar71 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar71 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar71 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar71 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar71 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar71._14_2_ >> 7 & 1) == 0) && (auVar71._14_2_ & 0x8000) == 0) break;
                      bVar36 = uVar21 < uVar32;
                      lVar34 = lVar34 + 0x10;
                      lVar33 = lVar33 + uVar27 * 4;
                      uVar21 = uVar21 + 1;
                      auVar70 = auVar72;
                      auVar46 = auVar44;
                    } while (lVar29 != lVar34);
                  } while ((!bVar36) && (bVar36 = uVar3 < 7, uVar3 = uVar3 + 1, bVar36));
                  uVar22 = uVar22 + 1;
                  lVar25 = lVar25 + 4;
                  palVar20 = ptr_02;
                  if (uVar22 == uVar28) {
                    uVar27 = ptr[(uint)(iVar26 % iVar31)][0];
                    uVar32 = ptr[(uint)(iVar26 % iVar31)][1];
                    if (iVar26 / iVar31 < 7) {
                      iVar18 = 1;
                      if (1 < iVar17) {
                        iVar18 = iVar17;
                      }
                      do {
                        uVar32 = uVar32 << 0x10 | uVar27 >> 0x30;
                        iVar18 = iVar18 + -1;
                        uVar27 = uVar27 << 0x10;
                      } while (iVar18 != 0);
                    }
                    sVar37 = auVar39._0_2_;
                    auVar41._0_2_ = -(ushort)((short)auVar44._0_2_ < sVar37);
                    sVar42 = auVar39._2_2_;
                    auVar41._2_2_ = -(ushort)((short)auVar44._2_2_ < sVar42);
                    auVar41._4_2_ = -(ushort)((short)auVar44._4_2_ < sVar37);
                    auVar41._6_2_ = -(ushort)((short)auVar44._6_2_ < sVar42);
                    auVar41._8_2_ = -(ushort)((short)auVar44._8_2_ < sVar37);
                    auVar41._10_2_ = -(ushort)((short)auVar44._10_2_ < sVar42);
                    auVar41._12_2_ = -(ushort)((short)auVar44._12_2_ < sVar37);
                    auVar41._14_2_ = -(ushort)((short)auVar44._14_2_ < sVar42);
                    sVar37 = auVar43._0_2_;
                    auVar39._0_2_ = -(ushort)(sVar37 < (short)auVar72._0_2_);
                    sVar42 = auVar43._2_2_;
                    auVar39._2_2_ = -(ushort)(sVar42 < (short)auVar72._2_2_);
                    auVar39._4_2_ = -(ushort)(sVar37 < (short)auVar72._4_2_);
                    auVar39._6_2_ = -(ushort)(sVar42 < (short)auVar72._6_2_);
                    auVar39._8_2_ = -(ushort)(sVar37 < (short)auVar72._8_2_);
                    auVar39._10_2_ = -(ushort)(sVar42 < (short)auVar72._10_2_);
                    auVar39._12_2_ = -(ushort)(sVar37 < (short)auVar72._12_2_);
                    auVar39._14_2_ = -(ushort)(sVar42 < (short)auVar72._14_2_);
                    auVar39 = auVar39 | auVar41;
                    if ((((((((((((((((auVar39 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar39 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar39 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar39 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar39 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar39 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar39 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar39 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar39 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar39 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar39 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar39 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar39 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar39 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar39 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar39[0xf]) {
                      sVar37 = (short)(uVar32 >> 0x30);
                    }
                    else {
                      *(byte *)&ppVar19->flag = (byte)ppVar19->flag | 0x40;
                      sVar37 = 0;
                      iVar16 = 0;
                      iVar26 = 0;
                    }
                    ppVar19->score = (int)sVar37;
                    ppVar19->end_query = iVar26;
                    ppVar19->end_ref = iVar16;
                    parasail_free(ptr_01);
                    parasail_free(ptr_00);
                    parasail_free(ptr_02);
                    parasail_free(ptr);
                    return ppVar19;
                  }
                } while( true );
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int16_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int16_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_16_t h;
            __m128i_16_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT16_MIN ? INT16_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT16_MIN ? INT16_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 2);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi16(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi16(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi16(vH, vE);
            vH = _mm_max_epi16(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi16(vH, vGapO);
            vE = _mm_subs_epi16(vE, vGapE);
            vE = _mm_max_epi16(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi16(vF, vGapE);
            vF = _mm_max_epi16(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int16_t tmp2 = tmp < INT16_MIN ? INT16_MIN : tmp;
            vF = _mm_slli_si128(vF, 2);
            vF = _mm_insert_epi16(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi16(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi16(vH, vGapO);
                vF = _mm_subs_epi16(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi16(vF, vH))) goto end;
                /*vF = _mm_max_epi16(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 2);
        }
        score = (int16_t) _mm_extract_epi16 (vH, 7);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}